

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_update_callback(void *ctx)

{
  unsigned_long uVar1;
  Terminal *term;
  
  if ((*(char *)((long)ctx + 0x1119) == '\x01') && (*(char *)((long)ctx + 0x111a) == '\0')) {
    term_update((Terminal *)ctx);
    *(undefined1 *)((long)ctx + 0x111a) = 1;
    uVar1 = schedule_timer(0x14,term_timer,ctx);
    *(unsigned_long *)((long)ctx + 0x1120) = uVar1;
  }
  return;
}

Assistant:

static void term_update_callback(void *ctx)
{
    Terminal *term = (Terminal *)ctx;
    if (!term->window_update_pending)
        return;
    if (!term->window_update_cooldown) {
        term_update(term);
        term->window_update_cooldown = true;
        term->window_update_cooldown_end = schedule_timer(
            UPDATE_DELAY, term_timer, term);
    }
}